

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void upperFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int n_00;
  uchar *puVar1;
  char *z;
  int local_34;
  int n;
  int i;
  char *z2;
  char *z1;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  puVar1 = sqlite3_value_text(*argv);
  n_00 = sqlite3_value_bytes(*argv);
  if ((puVar1 != (uchar *)0x0) &&
     (z = (char *)contextMalloc(context,(long)n_00 + 1), z != (char *)0x0)) {
    for (local_34 = 0; local_34 < n_00; local_34 = local_34 + 1) {
      z[local_34] = puVar1[local_34] & (""[puVar1[local_34]] & 0x20 ^ 0xff);
    }
    sqlite3_result_text(context,z,n_00,sqlite3_free);
  }
  return;
}

Assistant:

static void upperFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  char *z1;
  const char *z2;
  int i, n;
  UNUSED_PARAMETER(argc);
  z2 = (char*)sqlite3_value_text(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  /* Verify that the call to _bytes() does not invalidate the _text() pointer */
  assert( z2==(char*)sqlite3_value_text(argv[0]) );
  if( z2 ){
    z1 = contextMalloc(context, ((i64)n)+1);
    if( z1 ){
      for(i=0; i<n; i++){
        z1[i] = (char)sqlite3Toupper(z2[i]);
      }
      sqlite3_result_text(context, z1, n, sqlite3_free);
    }
  }
}